

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_ft_stroker.cpp
# Opt level: O0

SW_FT_Error
ft_stroke_border_arcto
          (SW_FT_StrokeBorder border,SW_FT_Vector *center,SW_FT_Fixed radius,SW_FT_Angle angle_start
          ,SW_FT_Angle angle_diff)

{
  SW_FT_Fixed SVar1;
  SW_FT_Long SVar2;
  SW_FT_Fixed in_RCX;
  long lVar3;
  long lVar4;
  long *in_RSI;
  long in_R8;
  SW_FT_Error error;
  SW_FT_Int arcs;
  SW_FT_Int i;
  SW_FT_Vector a3;
  SW_FT_Vector a2;
  SW_FT_Vector a1;
  SW_FT_Vector a0;
  SW_FT_Fixed coef;
  SW_FT_Fixed in_stack_ffffffffffffff78;
  undefined3 uVar5;
  uint in_stack_ffffffffffffff80;
  SW_FT_Error SVar6;
  int iVar7;
  int iVar8;
  SW_FT_Vector *in_stack_ffffffffffffff90;
  SW_FT_Vector *in_stack_ffffffffffffff98;
  SW_FT_Long local_40;
  long local_38;
  
  iVar7 = 1;
  SVar6 = 0;
  while( true ) {
    lVar4 = (long)iVar7 * 0x5a0000;
    uVar5 = (undefined3)in_stack_ffffffffffffff80;
    in_stack_ffffffffffffff80 = CONCAT13(1,uVar5);
    if (in_R8 == lVar4 || SBORROW8(in_R8,lVar4) != in_R8 + (long)iVar7 * -0x5a0000 < 0) {
      lVar4 = -in_R8;
      lVar3 = (long)iVar7 * 0x5a0000;
      in_stack_ffffffffffffff80 =
           CONCAT13(lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + (long)iVar7 * -0x5a0000 < 0,
                    uVar5);
    }
    if ((char)(in_stack_ffffffffffffff80 >> 0x18) == '\0') break;
    iVar7 = iVar7 + 1;
  }
  SVar1 = SW_FT_Tan((ulong)in_stack_ffffffffffffff80);
  lVar4 = SVar1 / 3 + SVar1;
  SW_FT_Vector_From_Polar
            ((SW_FT_Vector *)CONCAT44(SVar6,in_stack_ffffffffffffff80),in_stack_ffffffffffffff78,
             0x110511);
  SW_FT_MulFix(-local_38,lVar4);
  SW_FT_MulFix(local_40,lVar4);
  iVar8 = 1;
  while( true ) {
    if (iVar7 < iVar8) {
      return SVar6;
    }
    SW_FT_Vector_From_Polar
              ((SW_FT_Vector *)CONCAT44(SVar6,in_stack_ffffffffffffff80),in_RCX,0x1105ca);
    SVar2 = SW_FT_MulFix((SW_FT_Long)in_stack_ffffffffffffff98,lVar4);
    SW_FT_MulFix(-(long)in_stack_ffffffffffffff90,lVar4);
    in_stack_ffffffffffffff90 = (SW_FT_Vector *)((long)&in_stack_ffffffffffffff90->x + *in_RSI);
    in_stack_ffffffffffffff98 = (SW_FT_Vector *)((long)&in_stack_ffffffffffffff98->x + in_RSI[1]);
    SVar6 = ft_stroke_border_cubicto
                      ((SW_FT_StrokeBorder)((long)&in_stack_ffffffffffffff90->x + SVar2),
                       in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
                       (SW_FT_Vector *)CONCAT44(iVar8,iVar7));
    if (SVar6 != 0) break;
    iVar8 = iVar8 + 1;
    SVar6 = 0;
  }
  return SVar6;
}

Assistant:

static SW_FT_Error
ft_stroke_border_arcto( SW_FT_StrokeBorder  border,
                        SW_FT_Vector*       center,
                        SW_FT_Fixed         radius,
                        SW_FT_Angle         angle_start,
                        SW_FT_Angle         angle_diff )
{
    SW_FT_Fixed   coef;
    SW_FT_Vector  a0, a1, a2, a3;
    SW_FT_Int     i, arcs = 1;
    SW_FT_Error   error = 0;


    /* number of cubic arcs to draw */
    while (  angle_diff > SW_FT_ARC_CUBIC_ANGLE * arcs ||
            -angle_diff > SW_FT_ARC_CUBIC_ANGLE * arcs )
      arcs++;

    /* control tangents */
    coef  = SW_FT_Tan( angle_diff / ( 4 * arcs ) );
    coef += coef / 3;

    /* compute start and first control point */
    SW_FT_Vector_From_Polar( &a0, radius, angle_start );
    a1.x = SW_FT_MulFix( -a0.y, coef );
    a1.y = SW_FT_MulFix(  a0.x, coef );

    a0.x += center->x;
    a0.y += center->y;
    a1.x += a0.x;
    a1.y += a0.y;

    for ( i = 1; i <= arcs; i++ )
    {
      /* compute end and second control point */
      SW_FT_Vector_From_Polar( &a3, radius,
                            angle_start + i * angle_diff / arcs );
      a2.x = SW_FT_MulFix(  a3.y, coef );
      a2.y = SW_FT_MulFix( -a3.x, coef );

      a3.x += center->x;
      a3.y += center->y;
      a2.x += a3.x;
      a2.y += a3.y;

      /* add cubic arc */
      error = ft_stroke_border_cubicto( border, &a1, &a2, &a3 );
      if ( error )
        break;

      /* a0 = a3; */
      a1.x = a3.x - a2.x + a3.x;
      a1.y = a3.y - a2.y + a3.y;
    }

    return error;
}